

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O1

MaybeResult<wasm::Ok> *
wasm::WATParser::data<wasm::WATParser::ParseDeclsCtx>
          (MaybeResult<wasm::Ok> *__return_storage_ptr__,ParseDeclsCtx *ctx)

{
  undefined8 *puVar1;
  size_t sVar2;
  bool bVar3;
  undefined8 extraout_RAX;
  MemoryIdxT *pMVar4;
  undefined1 *puVar5;
  MemoryIdxT *data;
  string_view expected;
  string_view expected_00;
  Name name;
  undefined1 local_160 [8];
  MaybeResult<wasm::Ok> mem;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_128;
  string local_118;
  string local_f8;
  string local_d8;
  char *local_b8;
  size_t local_b0;
  undefined1 local_a8 [8];
  Result<std::vector<char,_std::allocator<char>_>_> str;
  undefined8 local_78;
  undefined1 local_70;
  undefined7 uStack_6f;
  undefined8 uStack_68;
  undefined4 local_5c;
  undefined1 local_58 [8];
  Result<wasm::Ok> _val_1;
  
  sVar2 = (ctx->in).pos;
  expected._M_str = "data";
  expected._M_len = 4;
  bVar3 = Lexer::takeSExprStart(&ctx->in,expected);
  if (!bVar3) {
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) = '\x01';
    return __return_storage_ptr__;
  }
  Lexer::takeID((optional<wasm::Name> *)local_160,&ctx->in);
  if (mem.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u._8_1_ == '\0') {
    local_b8 = (char *)0x0;
    local_b0 = 0;
  }
  else {
    local_b8 = (char *)mem.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u._0_8_;
    local_b0 = (size_t)local_160;
  }
  maybeMemuse<wasm::WATParser::ParseDeclsCtx>((MaybeResult<wasm::Ok> *)local_160,ctx);
  std::__detail::__variant::_Copy_ctor_base<false,_wasm::Ok,_wasm::None,_wasm::Err>::_Copy_ctor_base
            ((_Copy_ctor_base<false,_wasm::Ok,_wasm::None,_wasm::Err> *)local_a8,
             (_Copy_ctor_base<false,_wasm::Ok,_wasm::None,_wasm::Err> *)local_160);
  if (str.val.super__Variant_base<std::vector<char,_std::allocator<char>_>,_wasm::Err>.
      super__Move_assign_alias<std::vector<char>,_wasm::Err>.
      super__Copy_assign_alias<std::vector<char>,_wasm::Err>.
      super__Move_ctor_alias<std::vector<char>,_wasm::Err>.
      super__Copy_ctor_alias<std::vector<char>,_wasm::Err>.
      super__Variant_storage_alias<std::vector<char>,_wasm::Err>._M_u._24_1_ == '\x02') {
    local_58 = (undefined1  [8])
               ((long)&_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 8);
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_58,local_a8,
               (undefined1 *)
               (str.val.super__Variant_base<std::vector<char,_std::allocator<char>_>,_wasm::Err>.
                super__Move_assign_alias<std::vector<char>,_wasm::Err>.
                super__Copy_assign_alias<std::vector<char>,_wasm::Err>.
                super__Move_ctor_alias<std::vector<char>,_wasm::Err>.
                super__Copy_ctor_alias<std::vector<char>,_wasm::Err>.
                super__Variant_storage_alias<std::vector<char>,_wasm::Err>._M_u._0_8_ +
               (long)local_a8));
LAB_00b98003:
    puVar5 = (undefined1 *)
             ((long)&_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 8);
    puVar1 = (undefined8 *)
             ((long)&(__return_storage_ptr__->val).
                     super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10);
    *(undefined8 **)
     &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = puVar1;
    if (local_58 == (undefined1  [8])puVar5) {
      *puVar1 = CONCAT71(_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                         super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._9_7_,
                         _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                         super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._8_1_);
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x18) =
           _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
           super__Move_assign_alias<wasm::Ok,_wasm::Err>.
           super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>
           .super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
           super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._16_8_;
    }
    else {
      *(undefined1 (*) [8])
       &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = local_58;
      *(ulong *)((long)&(__return_storage_ptr__->val).
                        super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                        super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                        super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                        super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                        super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                        super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10) =
           CONCAT71(_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                    super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                    super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                    super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                    super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                    super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._9_7_,
                    _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                    super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                    super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                    super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                    super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                    super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._8_1_);
    }
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 8) =
         _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
         super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>
         .super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
         super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._0_8_;
    _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
    super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
    super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
    super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._0_8_ = 0;
    _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
    super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
    super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
    super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._8_1_ = 0;
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) = '\x02';
    local_58 = (undefined1  [8])puVar5;
    std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err>::
    ~_Variant_storage((_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err> *)local_a8);
  }
  else {
    std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err>::
    ~_Variant_storage((_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err> *)local_a8);
    expected_00._M_str = "offset";
    expected_00._M_len = 6;
    bVar3 = Lexer::takeSExprStart(&ctx->in,expected_00);
    if (bVar3) {
      expr<wasm::WATParser::ParseDeclsCtx>((Result<wasm::Ok> *)local_a8,ctx);
      std::__detail::__variant::_Copy_ctor_base<false,_wasm::Ok,_wasm::Err>::_Copy_ctor_base
                ((_Copy_ctor_base<false,_wasm::Ok,_wasm::Err> *)local_58,
                 (_Copy_ctor_base<false,_wasm::Ok,_wasm::Err> *)local_a8);
      if (_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._24_1_ == '\x01') {
        str.val.super__Variant_base<std::vector<char,_std::allocator<char>_>,_wasm::Err>.
        super__Move_assign_alias<std::vector<char>,_wasm::Err>.
        super__Copy_assign_alias<std::vector<char>,_wasm::Err>.
        super__Move_ctor_alias<std::vector<char>,_wasm::Err>.
        super__Copy_ctor_alias<std::vector<char>,_wasm::Err>.
        super__Variant_storage_alias<std::vector<char>,_wasm::Err>._32_8_ = &local_70;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)
                   ((long)&str.val.
                           super__Variant_base<std::vector<char,_std::allocator<char>_>,_wasm::Err>.
                           super__Move_assign_alias<std::vector<char>,_wasm::Err>.
                           super__Copy_assign_alias<std::vector<char>,_wasm::Err>.
                           super__Move_ctor_alias<std::vector<char>,_wasm::Err>.
                           super__Copy_ctor_alias<std::vector<char>,_wasm::Err> + 0x20),local_58,
                   (undefined1 *)
                   (_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                    super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                    super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                    super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                    super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                    super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._0_8_ + (long)local_58));
        puVar1 = (undefined8 *)
                 ((long)&(__return_storage_ptr__->val).
                         super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10);
        *(undefined8 **)
         &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = puVar1;
        if ((undefined1 *)
            str.val.super__Variant_base<std::vector<char,_std::allocator<char>_>,_wasm::Err>.
            super__Move_assign_alias<std::vector<char>,_wasm::Err>.
            super__Copy_assign_alias<std::vector<char>,_wasm::Err>.
            super__Move_ctor_alias<std::vector<char>,_wasm::Err>.
            super__Copy_ctor_alias<std::vector<char>,_wasm::Err>.
            super__Variant_storage_alias<std::vector<char>,_wasm::Err>._32_8_ == &local_70) {
          *puVar1 = CONCAT71(uStack_6f,local_70);
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->val).
                   super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x18) = uStack_68
          ;
        }
        else {
          *(undefined8 *)
           &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> =
               str.val.super__Variant_base<std::vector<char,_std::allocator<char>_>,_wasm::Err>.
               super__Move_assign_alias<std::vector<char>,_wasm::Err>.
               super__Copy_assign_alias<std::vector<char>,_wasm::Err>.
               super__Move_ctor_alias<std::vector<char>,_wasm::Err>.
               super__Copy_ctor_alias<std::vector<char>,_wasm::Err>.
               super__Variant_storage_alias<std::vector<char>,_wasm::Err>._32_8_;
          *(ulong *)((long)&(__return_storage_ptr__->val).
                            super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                            super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                            super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                            super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                            super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                            super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10) =
               CONCAT71(uStack_6f,local_70);
        }
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 8) = local_78;
        local_70 = 0;
        *(__index_type *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) = '\x02';
        str.val.super__Variant_base<std::vector<char,_std::allocator<char>_>,_wasm::Err>.
        super__Move_assign_alias<std::vector<char>,_wasm::Err>.
        super__Copy_assign_alias<std::vector<char>,_wasm::Err>.
        super__Move_ctor_alias<std::vector<char>,_wasm::Err>.
        super__Copy_ctor_alias<std::vector<char>,_wasm::Err>.
        super__Variant_storage_alias<std::vector<char>,_wasm::Err>._32_8_ = &local_70;
        std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                  ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_58);
      }
      else {
        std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                  ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_58);
        bVar3 = Lexer::takeRParen(&ctx->in);
        if (bVar3) {
LAB_00b98156:
          std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                    ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_a8);
          local_5c = (undefined4)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
          goto LAB_00b98167;
        }
        mem.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._32_8_ = &local_128;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)
                   ((long)&mem.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20),
                   "expected end of offset expression","");
        Lexer::err((Err *)local_58,&ctx->in,
                   (string *)
                   ((long)&mem.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20));
        puVar1 = (undefined8 *)
                 ((long)&(__return_storage_ptr__->val).
                         super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10);
        *(undefined8 **)
         &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = puVar1;
        puVar5 = (undefined1 *)
                 ((long)&_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 8);
        if (local_58 == (undefined1  [8])puVar5) {
          *puVar1 = CONCAT71(_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                             super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                             super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                             super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                             super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._9_7_,
                             _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                             super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                             super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                             super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                             super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._8_1_);
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->val).
                   super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x18) =
               _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._16_8_;
        }
        else {
          *(undefined1 (*) [8])
           &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = local_58;
          *(ulong *)((long)&(__return_storage_ptr__->val).
                            super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                            super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                            super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                            super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                            super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                            super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10) =
               CONCAT71(_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                        super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                        super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                        super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                        super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._9_7_,
                        _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                        super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                        super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                        super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                        super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._8_1_);
        }
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 8) =
             _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>
             .super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._0_8_;
        _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._0_8_ = 0;
        _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._8_1_ = 0;
        *(__index_type *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) = '\x02';
        local_58 = (undefined1  [8])puVar5;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)mem.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._32_8_ != &local_128) {
          operator_delete((void *)mem.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                                  super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                  super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                  super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                  super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                  super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                  _32_8_,local_128._M_allocated_capacity + 1);
        }
      }
    }
    else {
      bVar3 = Lexer::takeLParen(&ctx->in);
      if (!bVar3) {
        local_5c = 0;
LAB_00b98167:
        if ((mem.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u._24_1_ == '\x01') ||
           ((byte)local_5c != '\0')) {
          datastring<wasm::WATParser::ParseDeclsCtx>
                    ((Result<std::vector<char,_std::allocator<char>_>_> *)local_a8,ctx);
          std::__detail::__variant::
          _Copy_ctor_base<false,_std::vector<char,_std::allocator<char>_>,_wasm::Err>::
          _Copy_ctor_base((_Copy_ctor_base<false,_std::vector<char,_std::allocator<char>_>,_wasm::Err>
                           *)local_58,
                          (_Copy_ctor_base<false,_std::vector<char,_std::allocator<char>_>,_wasm::Err>
                           *)local_a8);
          if (_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
              super__Move_assign_alias<wasm::Ok,_wasm::Err>.
              super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
              super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
              super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._24_1_ == '\x01') {
            str.val.super__Variant_base<std::vector<char,_std::allocator<char>_>,_wasm::Err>.
            super__Move_assign_alias<std::vector<char>,_wasm::Err>.
            super__Copy_assign_alias<std::vector<char>,_wasm::Err>.
            super__Move_ctor_alias<std::vector<char>,_wasm::Err>.
            super__Copy_ctor_alias<std::vector<char>,_wasm::Err>.
            super__Variant_storage_alias<std::vector<char>,_wasm::Err>._32_8_ = &local_70;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)
                       ((long)&str.val.
                               super__Variant_base<std::vector<char,_std::allocator<char>_>,_wasm::Err>
                               .super__Move_assign_alias<std::vector<char>,_wasm::Err>.
                               super__Copy_assign_alias<std::vector<char>,_wasm::Err>.
                               super__Move_ctor_alias<std::vector<char>,_wasm::Err>.
                               super__Copy_ctor_alias<std::vector<char>,_wasm::Err> + 0x20),local_58
                       ,(undefined1 *)
                        (_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                         super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._0_8_ +
                        (long)local_58));
            puVar1 = (undefined8 *)
                     ((long)&(__return_storage_ptr__->val).
                             super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10);
            *(undefined8 **)
             &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = puVar1;
            if ((undefined1 *)
                str.val.super__Variant_base<std::vector<char,_std::allocator<char>_>,_wasm::Err>.
                super__Move_assign_alias<std::vector<char>,_wasm::Err>.
                super__Copy_assign_alias<std::vector<char>,_wasm::Err>.
                super__Move_ctor_alias<std::vector<char>,_wasm::Err>.
                super__Copy_ctor_alias<std::vector<char>,_wasm::Err>.
                super__Variant_storage_alias<std::vector<char>,_wasm::Err>._32_8_ == &local_70) {
              *puVar1 = CONCAT71(uStack_6f,local_70);
              *(undefined8 *)
               ((long)&(__return_storage_ptr__->val).
                       super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x18) =
                   uStack_68;
            }
            else {
              *(undefined8 *)
               &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> =
                   str.val.super__Variant_base<std::vector<char,_std::allocator<char>_>,_wasm::Err>.
                   super__Move_assign_alias<std::vector<char>,_wasm::Err>.
                   super__Copy_assign_alias<std::vector<char>,_wasm::Err>.
                   super__Move_ctor_alias<std::vector<char>,_wasm::Err>.
                   super__Copy_ctor_alias<std::vector<char>,_wasm::Err>.
                   super__Variant_storage_alias<std::vector<char>,_wasm::Err>._32_8_;
              *(ulong *)((long)&(__return_storage_ptr__->val).
                                super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                                super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10
                        ) = CONCAT71(uStack_6f,local_70);
            }
            *(undefined8 *)
             ((long)&(__return_storage_ptr__->val).
                     super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 8) = local_78;
            local_70 = 0;
            *(__index_type *)
             ((long)&(__return_storage_ptr__->val).
                     super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) = '\x02';
            str.val.super__Variant_base<std::vector<char,_std::allocator<char>_>,_wasm::Err>.
            super__Move_assign_alias<std::vector<char>,_wasm::Err>.
            super__Copy_assign_alias<std::vector<char>,_wasm::Err>.
            super__Move_ctor_alias<std::vector<char>,_wasm::Err>.
            super__Copy_ctor_alias<std::vector<char>,_wasm::Err>.
            super__Variant_storage_alias<std::vector<char>,_wasm::Err>._32_8_ = &local_70;
            std::__detail::__variant::
            _Variant_storage<false,_std::vector<char,_std::allocator<char>_>,_wasm::Err>::
            ~_Variant_storage((_Variant_storage<false,_std::vector<char,_std::allocator<char>_>,_wasm::Err>
                               *)local_58);
          }
          else {
            std::__detail::__variant::
            _Variant_storage<false,_std::vector<char,_std::allocator<char>_>,_wasm::Err>::
            ~_Variant_storage((_Variant_storage<false,_std::vector<char,_std::allocator<char>_>,_wasm::Err>
                               *)local_58);
            bVar3 = Lexer::takeRParen(&ctx->in);
            if (bVar3) {
              pMVar4 = (MemoryIdxT *)local_160;
              if (mem.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                  super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                  super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                  super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                  super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                  super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u._24_1_ != '\0')
              {
                pMVar4 = (MemoryIdxT *)0x0;
              }
              data = (MemoryIdxT *)local_a8;
              if (str.val.super__Variant_base<std::vector<char,_std::allocator<char>_>,_wasm::Err>.
                  super__Move_assign_alias<std::vector<char>,_wasm::Err>.
                  super__Copy_assign_alias<std::vector<char>,_wasm::Err>.
                  super__Move_ctor_alias<std::vector<char>,_wasm::Err>.
                  super__Copy_ctor_alias<std::vector<char>,_wasm::Err>.
                  super__Variant_storage_alias<std::vector<char>,_wasm::Err>._M_u._24_1_ != '\0') {
                data = (MemoryIdxT *)0x0;
              }
              name.super_IString.str._M_str = local_b8;
              name.super_IString.str._M_len = local_b0;
              ParseDeclsCtx::addData
                        ((Result<wasm::Ok> *)local_58,ctx,name,pMVar4,
                         (optional<wasm::Ok>)((ushort)(byte)local_5c << 8),
                         (vector<char,_std::allocator<char>_> *)data,(Index)sVar2);
              if (_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                  super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                  super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                  super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                  super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                  super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._24_1_ == '\x01') {
                str.val.super__Variant_base<std::vector<char,_std::allocator<char>_>,_wasm::Err>.
                super__Move_assign_alias<std::vector<char>,_wasm::Err>.
                super__Copy_assign_alias<std::vector<char>,_wasm::Err>.
                super__Move_ctor_alias<std::vector<char>,_wasm::Err>.
                super__Copy_ctor_alias<std::vector<char>,_wasm::Err>.
                super__Variant_storage_alias<std::vector<char>,_wasm::Err>._32_8_ = &local_70;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)
                           ((long)&str.val.
                                   super__Variant_base<std::vector<char,_std::allocator<char>_>,_wasm::Err>
                                   .super__Move_assign_alias<std::vector<char>,_wasm::Err>.
                                   super__Copy_assign_alias<std::vector<char>,_wasm::Err>.
                                   super__Move_ctor_alias<std::vector<char>,_wasm::Err>.
                                   super__Copy_ctor_alias<std::vector<char>,_wasm::Err> + 0x20),
                           local_58,(undefined1 *)
                                    (_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                     super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                     super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                     super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                     super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                                     super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._0_8_ +
                                    (long)local_58));
                puVar1 = (undefined8 *)
                         ((long)&(__return_storage_ptr__->val).
                                 super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                                 super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                 super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                 super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                 super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                 super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> +
                         0x10);
                *(undefined8 **)
                 &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>
                  .super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                  super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                  super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                  super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                  super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = puVar1;
                if ((undefined1 *)
                    str.val.super__Variant_base<std::vector<char,_std::allocator<char>_>,_wasm::Err>
                    .super__Move_assign_alias<std::vector<char>,_wasm::Err>.
                    super__Copy_assign_alias<std::vector<char>,_wasm::Err>.
                    super__Move_ctor_alias<std::vector<char>,_wasm::Err>.
                    super__Copy_ctor_alias<std::vector<char>,_wasm::Err>.
                    super__Variant_storage_alias<std::vector<char>,_wasm::Err>._32_8_ == &local_70)
                {
                  *puVar1 = CONCAT71(uStack_6f,local_70);
                  *(undefined8 *)
                   ((long)&(__return_storage_ptr__->val).
                           super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x18) =
                       uStack_68;
                }
                else {
                  *(undefined8 *)
                   &(__return_storage_ptr__->val).
                    super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                    super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                    super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                    super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                    super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                    super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> =
                       str.val.
                       super__Variant_base<std::vector<char,_std::allocator<char>_>,_wasm::Err>.
                       super__Move_assign_alias<std::vector<char>,_wasm::Err>.
                       super__Copy_assign_alias<std::vector<char>,_wasm::Err>.
                       super__Move_ctor_alias<std::vector<char>,_wasm::Err>.
                       super__Copy_ctor_alias<std::vector<char>,_wasm::Err>.
                       super__Variant_storage_alias<std::vector<char>,_wasm::Err>._32_8_;
                  *(ulong *)((long)&(__return_storage_ptr__->val).
                                    super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                                    super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                    super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                    super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                    super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                    super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> +
                            0x10) = CONCAT71(uStack_6f,local_70);
                }
                *(undefined8 *)
                 ((long)&(__return_storage_ptr__->val).
                         super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 8) =
                     local_78;
                local_70 = 0;
                *(__index_type *)
                 ((long)&(__return_storage_ptr__->val).
                         super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) =
                     '\x02';
                str.val.super__Variant_base<std::vector<char,_std::allocator<char>_>,_wasm::Err>.
                super__Move_assign_alias<std::vector<char>,_wasm::Err>.
                super__Copy_assign_alias<std::vector<char>,_wasm::Err>.
                super__Move_ctor_alias<std::vector<char>,_wasm::Err>.
                super__Copy_ctor_alias<std::vector<char>,_wasm::Err>.
                super__Variant_storage_alias<std::vector<char>,_wasm::Err>._32_8_ = &local_70;
                std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::
                ~_Variant_storage((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_58);
              }
              else {
                std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::
                ~_Variant_storage((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_58);
                *(__index_type *)
                 ((long)&(__return_storage_ptr__->val).
                         super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) =
                     '\0';
              }
            }
            else {
              local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_d8,"expected end of data segment","");
              Lexer::err((Err *)local_58,&ctx->in,&local_d8);
              puVar1 = (undefined8 *)
                       ((long)&(__return_storage_ptr__->val).
                               super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                               super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                               super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                               super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                               super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                               super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10)
              ;
              *(undefined8 **)
               &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = puVar1;
              puVar5 = (undefined1 *)
                       ((long)&_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                               super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 8);
              if (local_58 == (undefined1  [8])puVar5) {
                *puVar1 = CONCAT71(_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                   super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                   super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                   super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                   super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                                   super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._9_7_,
                                   _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                   super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                   super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                   super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                   super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                                   super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._8_1_);
                *(undefined8 *)
                 ((long)&(__return_storage_ptr__->val).
                         super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x18) =
                     _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._16_8_;
              }
              else {
                *(undefined1 (*) [8])
                 &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>
                  .super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                  super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                  super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                  super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                  super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = local_58;
                *(ulong *)((long)&(__return_storage_ptr__->val).
                                  super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                                  super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                  super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                  super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                  super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                  super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> +
                          0x10) =
                     CONCAT71(_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                              super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                              super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                              super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                              super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                              super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._9_7_,
                              _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                              super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                              super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                              super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                              super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                              super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._8_1_);
              }
              *(undefined8 *)
               ((long)&(__return_storage_ptr__->val).
                       super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 8) =
                   _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._0_8_;
              _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
              super__Move_assign_alias<wasm::Ok,_wasm::Err>.
              super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
              super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
              super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._0_8_ = 0;
              _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
              super__Move_assign_alias<wasm::Ok,_wasm::Err>.
              super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
              super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
              super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._8_1_ = 0;
              *(__index_type *)
               ((long)&(__return_storage_ptr__->val).
                       super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) =
                   '\x02';
              local_58 = (undefined1  [8])puVar5;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
                operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1
                               );
              }
            }
          }
          std::__detail::__variant::
          _Variant_storage<false,_std::vector<char,_std::allocator<char>_>,_wasm::Err>::
          ~_Variant_storage((_Variant_storage<false,_std::vector<char,_std::allocator<char>_>,_wasm::Err>
                             *)local_a8);
        }
        else {
          local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_f8,"expected offset for active segment","");
          Lexer::err((Err *)local_a8,&ctx->in,&local_f8);
          puVar1 = (undefined8 *)
                   ((long)&(__return_storage_ptr__->val).
                           super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10);
          *(undefined8 **)
           &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = puVar1;
          puVar5 = (undefined1 *)
                   ((long)&str.val.
                           super__Variant_base<std::vector<char,_std::allocator<char>_>,_wasm::Err>.
                           super__Move_assign_alias<std::vector<char>,_wasm::Err>.
                           super__Copy_assign_alias<std::vector<char>,_wasm::Err>.
                           super__Move_ctor_alias<std::vector<char>,_wasm::Err>.
                           super__Copy_ctor_alias<std::vector<char>,_wasm::Err> + 8);
          if (local_a8 == (undefined1  [8])puVar5) {
            *puVar1 = CONCAT71(str.val.
                               super__Variant_base<std::vector<char,_std::allocator<char>_>,_wasm::Err>
                               .super__Move_assign_alias<std::vector<char>,_wasm::Err>.
                               super__Copy_assign_alias<std::vector<char>,_wasm::Err>.
                               super__Move_ctor_alias<std::vector<char>,_wasm::Err>.
                               super__Copy_ctor_alias<std::vector<char>,_wasm::Err>.
                               super__Variant_storage_alias<std::vector<char>,_wasm::Err>._M_u._9_7_
                               ,str.val.
                                super__Variant_base<std::vector<char,_std::allocator<char>_>,_wasm::Err>
                                .super__Move_assign_alias<std::vector<char>,_wasm::Err>.
                                super__Copy_assign_alias<std::vector<char>,_wasm::Err>.
                                super__Move_ctor_alias<std::vector<char>,_wasm::Err>.
                                super__Copy_ctor_alias<std::vector<char>,_wasm::Err>.
                                super__Variant_storage_alias<std::vector<char>,_wasm::Err>._M_u.
                                _M_first._M_storage._M_storage[8]);
            *(undefined8 *)
             ((long)&(__return_storage_ptr__->val).
                     super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x18) =
                 str.val.super__Variant_base<std::vector<char,_std::allocator<char>_>,_wasm::Err>.
                 super__Move_assign_alias<std::vector<char>,_wasm::Err>.
                 super__Copy_assign_alias<std::vector<char>,_wasm::Err>.
                 super__Move_ctor_alias<std::vector<char>,_wasm::Err>.
                 super__Copy_ctor_alias<std::vector<char>,_wasm::Err>.
                 super__Variant_storage_alias<std::vector<char>,_wasm::Err>._M_u._16_8_;
          }
          else {
            *(undefined1 (*) [8])
             &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = local_a8;
            *(ulong *)((long)&(__return_storage_ptr__->val).
                              super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                              super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                              super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                              super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                              super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                              super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10)
                 = CONCAT71(str.val.
                            super__Variant_base<std::vector<char,_std::allocator<char>_>,_wasm::Err>
                            .super__Move_assign_alias<std::vector<char>,_wasm::Err>.
                            super__Copy_assign_alias<std::vector<char>,_wasm::Err>.
                            super__Move_ctor_alias<std::vector<char>,_wasm::Err>.
                            super__Copy_ctor_alias<std::vector<char>,_wasm::Err>.
                            super__Variant_storage_alias<std::vector<char>,_wasm::Err>._M_u._9_7_,
                            str.val.
                            super__Variant_base<std::vector<char,_std::allocator<char>_>,_wasm::Err>
                            .super__Move_assign_alias<std::vector<char>,_wasm::Err>.
                            super__Copy_assign_alias<std::vector<char>,_wasm::Err>.
                            super__Move_ctor_alias<std::vector<char>,_wasm::Err>.
                            super__Copy_ctor_alias<std::vector<char>,_wasm::Err>.
                            super__Variant_storage_alias<std::vector<char>,_wasm::Err>._M_u._M_first
                            ._M_storage._M_storage[8]);
          }
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->val).
                   super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 8) =
               str.val.super__Variant_base<std::vector<char,_std::allocator<char>_>,_wasm::Err>.
               super__Move_assign_alias<std::vector<char>,_wasm::Err>.
               super__Copy_assign_alias<std::vector<char>,_wasm::Err>.
               super__Move_ctor_alias<std::vector<char>,_wasm::Err>.
               super__Copy_ctor_alias<std::vector<char>,_wasm::Err>.
               super__Variant_storage_alias<std::vector<char>,_wasm::Err>._M_u._0_8_;
          str.val.super__Variant_base<std::vector<char,_std::allocator<char>_>,_wasm::Err>.
          super__Move_assign_alias<std::vector<char>,_wasm::Err>.
          super__Copy_assign_alias<std::vector<char>,_wasm::Err>.
          super__Move_ctor_alias<std::vector<char>,_wasm::Err>.
          super__Copy_ctor_alias<std::vector<char>,_wasm::Err>.
          super__Variant_storage_alias<std::vector<char>,_wasm::Err>._M_u._0_8_ = 0;
          str.val.super__Variant_base<std::vector<char,_std::allocator<char>_>,_wasm::Err>.
          super__Move_assign_alias<std::vector<char>,_wasm::Err>.
          super__Copy_assign_alias<std::vector<char>,_wasm::Err>.
          super__Move_ctor_alias<std::vector<char>,_wasm::Err>.
          super__Copy_ctor_alias<std::vector<char>,_wasm::Err>.
          super__Variant_storage_alias<std::vector<char>,_wasm::Err>._M_u._M_first._M_storage.
          _M_storage[8] = '\0';
          *(__index_type *)
           ((long)&(__return_storage_ptr__->val).
                   super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) = '\x02';
          local_a8 = (undefined1  [8])puVar5;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
            operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
          }
        }
        goto LAB_00b98699;
      }
      instr<wasm::WATParser::ParseDeclsCtx>((MaybeResult<wasm::Ok> *)local_a8,ctx);
      if (str.val.super__Variant_base<std::vector<char,_std::allocator<char>_>,_wasm::Err>.
          super__Move_assign_alias<std::vector<char>,_wasm::Err>.
          super__Copy_assign_alias<std::vector<char>,_wasm::Err>.
          super__Move_ctor_alias<std::vector<char>,_wasm::Err>.
          super__Copy_ctor_alias<std::vector<char>,_wasm::Err>.
          super__Variant_storage_alias<std::vector<char>,_wasm::Err>._M_u._24_1_ == '\x02') {
        local_58 = (undefined1  [8])
                   ((long)&_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                           super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 8);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_58,local_a8,
                   (undefined1 *)
                   (str.val.super__Variant_base<std::vector<char,_std::allocator<char>_>,_wasm::Err>
                    .super__Move_assign_alias<std::vector<char>,_wasm::Err>.
                    super__Copy_assign_alias<std::vector<char>,_wasm::Err>.
                    super__Move_ctor_alias<std::vector<char>,_wasm::Err>.
                    super__Copy_ctor_alias<std::vector<char>,_wasm::Err>.
                    super__Variant_storage_alias<std::vector<char>,_wasm::Err>._M_u._0_8_ +
                   (long)local_a8));
        goto LAB_00b98003;
      }
      std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err>::
      ~_Variant_storage((_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err> *)local_a8);
      str.val.super__Variant_base<std::vector<char,_std::allocator<char>_>,_wasm::Err>.
      super__Move_assign_alias<std::vector<char>,_wasm::Err>.
      super__Copy_assign_alias<std::vector<char>,_wasm::Err>.
      super__Move_ctor_alias<std::vector<char>,_wasm::Err>.
      super__Copy_ctor_alias<std::vector<char>,_wasm::Err>.
      super__Variant_storage_alias<std::vector<char>,_wasm::Err>._M_u._24_1_ = 0;
      std::__detail::__variant::_Copy_ctor_base<false,_wasm::Ok,_wasm::Err>::_Copy_ctor_base
                ((_Copy_ctor_base<false,_wasm::Ok,_wasm::Err> *)local_58,
                 (_Copy_ctor_base<false,_wasm::Ok,_wasm::Err> *)local_a8);
      if (_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._24_1_ == '\x01') {
        str.val.super__Variant_base<std::vector<char,_std::allocator<char>_>,_wasm::Err>.
        super__Move_assign_alias<std::vector<char>,_wasm::Err>.
        super__Copy_assign_alias<std::vector<char>,_wasm::Err>.
        super__Move_ctor_alias<std::vector<char>,_wasm::Err>.
        super__Copy_ctor_alias<std::vector<char>,_wasm::Err>.
        super__Variant_storage_alias<std::vector<char>,_wasm::Err>._32_8_ = &local_70;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)
                   ((long)&str.val.
                           super__Variant_base<std::vector<char,_std::allocator<char>_>,_wasm::Err>.
                           super__Move_assign_alias<std::vector<char>,_wasm::Err>.
                           super__Copy_assign_alias<std::vector<char>,_wasm::Err>.
                           super__Move_ctor_alias<std::vector<char>,_wasm::Err>.
                           super__Copy_ctor_alias<std::vector<char>,_wasm::Err> + 0x20),local_58,
                   (undefined1 *)
                   (_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                    super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                    super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                    super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                    super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                    super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._0_8_ + (long)local_58));
        puVar1 = (undefined8 *)
                 ((long)&(__return_storage_ptr__->val).
                         super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10);
        *(undefined8 **)
         &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = puVar1;
        if ((undefined1 *)
            str.val.super__Variant_base<std::vector<char,_std::allocator<char>_>,_wasm::Err>.
            super__Move_assign_alias<std::vector<char>,_wasm::Err>.
            super__Copy_assign_alias<std::vector<char>,_wasm::Err>.
            super__Move_ctor_alias<std::vector<char>,_wasm::Err>.
            super__Copy_ctor_alias<std::vector<char>,_wasm::Err>.
            super__Variant_storage_alias<std::vector<char>,_wasm::Err>._32_8_ == &local_70) {
          *puVar1 = CONCAT71(uStack_6f,local_70);
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->val).
                   super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x18) = uStack_68
          ;
        }
        else {
          *(undefined8 *)
           &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> =
               str.val.super__Variant_base<std::vector<char,_std::allocator<char>_>,_wasm::Err>.
               super__Move_assign_alias<std::vector<char>,_wasm::Err>.
               super__Copy_assign_alias<std::vector<char>,_wasm::Err>.
               super__Move_ctor_alias<std::vector<char>,_wasm::Err>.
               super__Copy_ctor_alias<std::vector<char>,_wasm::Err>.
               super__Variant_storage_alias<std::vector<char>,_wasm::Err>._32_8_;
          *(ulong *)((long)&(__return_storage_ptr__->val).
                            super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                            super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                            super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                            super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                            super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                            super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10) =
               CONCAT71(uStack_6f,local_70);
        }
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 8) = local_78;
        local_70 = 0;
        *(__index_type *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) = '\x02';
        str.val.super__Variant_base<std::vector<char,_std::allocator<char>_>,_wasm::Err>.
        super__Move_assign_alias<std::vector<char>,_wasm::Err>.
        super__Copy_assign_alias<std::vector<char>,_wasm::Err>.
        super__Move_ctor_alias<std::vector<char>,_wasm::Err>.
        super__Copy_ctor_alias<std::vector<char>,_wasm::Err>.
        super__Variant_storage_alias<std::vector<char>,_wasm::Err>._32_8_ = &local_70;
        std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                  ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_58);
      }
      else {
        std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                  ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_58);
        bVar3 = Lexer::takeRParen(&ctx->in);
        if (bVar3) goto LAB_00b98156;
        local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_118,"expected end of offset instruction","");
        Lexer::err((Err *)local_58,&ctx->in,&local_118);
        puVar1 = (undefined8 *)
                 ((long)&(__return_storage_ptr__->val).
                         super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10);
        *(undefined8 **)
         &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = puVar1;
        puVar5 = (undefined1 *)
                 ((long)&_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 8);
        if (local_58 == (undefined1  [8])puVar5) {
          *puVar1 = CONCAT71(_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                             super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                             super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                             super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                             super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._9_7_,
                             _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                             super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                             super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                             super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                             super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._8_1_);
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->val).
                   super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x18) =
               _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._16_8_;
        }
        else {
          *(undefined1 (*) [8])
           &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = local_58;
          *(ulong *)((long)&(__return_storage_ptr__->val).
                            super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                            super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                            super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                            super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                            super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                            super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10) =
               CONCAT71(_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                        super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                        super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                        super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                        super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._9_7_,
                        _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                        super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                        super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                        super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                        super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._8_1_);
        }
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 8) =
             _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>
             .super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._0_8_;
        _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._0_8_ = 0;
        _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._8_1_ = 0;
        *(__index_type *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) = '\x02';
        local_58 = (undefined1  [8])puVar5;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_118._M_dataplus._M_p != &local_118.field_2) {
          operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
        }
      }
    }
    std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
              ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_a8);
  }
LAB_00b98699:
  std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err>::
  ~_Variant_storage((_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err> *)local_160);
  return __return_storage_ptr__;
}

Assistant:

MaybeResult<> data(Ctx& ctx) {
  auto pos = ctx.in.getPos();
  if (!ctx.in.takeSExprStart("data"sv)) {
    return {};
  }

  Name name;
  if (auto id = ctx.in.takeID()) {
    name = *id;
  }

  auto mem = maybeMemuse(ctx);
  CHECK_ERR(mem);

  std::optional<typename Ctx::ExprT> offset;
  if (ctx.in.takeSExprStart("offset"sv)) {
    auto e = expr(ctx);
    CHECK_ERR(e);
    if (!ctx.in.takeRParen()) {
      return ctx.in.err("expected end of offset expression");
    }
    offset = *e;
  } else if (ctx.in.takeLParen()) {
    CHECK_ERR(instr(ctx));
    auto offsetExpr = ctx.makeExpr();
    CHECK_ERR(offsetExpr);
    offset = *offsetExpr;
    if (!ctx.in.takeRParen()) {
      return ctx.in.err("expected end of offset instruction");
    }
  }

  if (mem && !offset) {
    return ctx.in.err("expected offset for active segment");
  }

  auto str = datastring(ctx);
  CHECK_ERR(str);

  if (!ctx.in.takeRParen()) {
    return ctx.in.err("expected end of data segment");
  }

  CHECK_ERR(ctx.addData(name, mem.getPtr(), offset, std::move(*str), pos));

  return Ok{};
}